

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O2

void anurbs::RTree<3L>::register_python(module *m)

{
  class_<anurbs::RTree<3l>> *pcVar1;
  string name;
  bool local_351;
  class_<anurbs::RTree<3L>_> local_350;
  object local_348;
  object local_340;
  object local_338;
  int local_32c;
  arg local_328;
  arg local_318;
  code *local_308;
  undefined8 local_300;
  arg local_2f8;
  arg local_2e8;
  code *local_2d8;
  undefined8 local_2d0;
  arg local_2c8;
  arg local_2b8;
  code *local_2a8;
  undefined8 local_2a0;
  code *local_298;
  undefined8 local_290;
  arg local_288;
  char *local_278 [4];
  arg local_258;
  arg_v local_248;
  arg local_208;
  arg_v local_1f8;
  arg local_1b8;
  arg_v local_1a8;
  arg local_168;
  arg_v local_158;
  arg local_118;
  arg local_108;
  code *local_f8;
  undefined8 local_f0;
  code *local_e8;
  undefined8 local_e0;
  code *local_d8;
  undefined8 local_d0;
  code *local_c8;
  undefined8 local_c0;
  code *local_b8;
  undefined8 local_b0;
  code *local_a8;
  undefined8 local_a0;
  code *local_98;
  undefined8 local_90;
  code *local_88;
  undefined8 local_80;
  arg local_78;
  arg_v local_68;
  
  RTree<3l>::python_name_abi_cxx11_();
  pybind11::class_<anurbs::RTree<3L>_>::class_<>
            (&local_350,(m->super_object).super_handle.m_ptr,local_278[0]);
  local_288.name = "nb_items";
  local_288._8_1_ = 2;
  local_32c = 0x10;
  local_78.name = "node_size";
  local_78._8_1_ = 2;
  pybind11::arg::operator=(&local_68,&local_78,&local_32c);
  pybind11::detail::initimpl::constructor<long,_long>::
  execute<pybind11::class_<anurbs::RTree<3L>_>,_pybind11::arg,_pybind11::arg_v,_0>
            (&local_350,&local_288,&local_68);
  local_88 = boxes_min;
  local_80 = 0;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def_property_readonly<std::vector<Eigen::Matrix<double,1,3,1,1,3>,std::allocator<Eigen::Matrix<double,1,3,1,1,3>>>const&(anurbs::RTree<3l>::*)()const>
                     ((class_<anurbs::RTree<3l>> *)&local_350,"_boxes_min",
                      (offset_in_Model_to_subr *)&local_88);
  local_98 = boxes_max;
  local_90 = 0;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def_property_readonly<std::vector<Eigen::Matrix<double,1,3,1,1,3>,std::allocator<Eigen::Matrix<double,1,3,1,1,3>>>const&(anurbs::RTree<3l>::*)()const>
                     (pcVar1,"_boxes_max",(offset_in_Model_to_subr *)&local_98);
  local_a8 = indices;
  local_a0 = 0;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def_property_readonly<std::vector<long,std::allocator<long>>const&(anurbs::RTree<3l>::*)()const>
                     (pcVar1,"indices",(offset_in_Model_to_subr *)&local_a8);
  local_b8 = min;
  local_b0 = 0;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def_property_readonly<Eigen::Matrix<double,1,3,1,1,3>(anurbs::RTree<3l>::*)()const>
                     (pcVar1,"min",(offset_in_Model_to_subr *)&local_b8);
  local_c8 = min;
  local_c0 = 0;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def_property_readonly<Eigen::Matrix<double,1,3,1,1,3>(anurbs::RTree<3l>::*)()const>
                     (pcVar1,"max",(offset_in_Model_to_subr *)&local_c8);
  local_d8 = nb_items;
  local_d0 = 0;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def_property_readonly<long(anurbs::RTree<3l>::*)()const>
                     (pcVar1,"nb_items",(offset_in_Model_to_subr *)&local_d8);
  local_e8 = node_size;
  local_e0 = 0;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def_property_readonly<long(anurbs::RTree<3l>::*)()const>
                     (pcVar1,"node_size",(offset_in_Model_to_subr *)&local_e8);
  local_f8 = add;
  local_f0 = 0;
  local_108.name = "box_a";
  local_108._8_1_ = 2;
  local_118.name = "box_b";
  local_118._8_1_ = 2;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def<void(anurbs::RTree<3l>::*)(Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>),pybind11::arg,pybind11::arg>
                     (pcVar1,"add",(offset_in_Model_to_subr *)&local_f8,&local_108,&local_118);
  local_298 = finish;
  local_290 = 0;
  local_351 = true;
  local_168.name = "hilbert_sort";
  local_168._8_1_ = 2;
  pybind11::arg::operator=(&local_158,&local_168,&local_351);
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def<void(anurbs::RTree<3l>::*)(bool),pybind11::arg_v>
                     (pcVar1,"finish",(offset_in_Model_to_subr *)&local_298,&local_158);
  local_2a8 = by_point;
  local_2a0 = 0;
  local_2b8.name = "location";
  local_2b8._8_1_ = 2;
  local_2c8.name = "tolerance";
  local_2c8._8_1_ = 2;
  local_338.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_1b8.name = "callback";
  local_1b8._8_1_ = 2;
  pybind11::arg::operator=(&local_1a8,&local_1b8,(none *)&local_338);
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def<std::vector<long,std::allocator<long>>(anurbs::RTree<3l>::*)(Eigen::Matrix<double,1,3,1,1,3>,double,std::function<bool(long)>),pybind11::arg,pybind11::arg,pybind11::arg_v>
                     (pcVar1,"by_point",(offset_in_Model_to_subr *)&local_2a8,&local_2b8,&local_2c8,
                      &local_1a8);
  local_2d8 = by_box;
  local_2d0 = 0;
  local_2e8.name = "box_a";
  local_2e8._8_1_ = 2;
  local_2f8.name = "box_b";
  local_2f8._8_1_ = 2;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_340.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  local_208.name = "callback";
  local_208._8_1_ = 2;
  pybind11::arg::operator=(&local_1f8,&local_208,(none *)&local_340);
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def<std::vector<long,std::allocator<long>>(anurbs::RTree<3l>::*)(Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,std::function<bool(long)>),pybind11::arg,pybind11::arg,pybind11::arg_v>
                     (pcVar1,"by_box",(offset_in_Model_to_subr *)&local_2d8,&local_2e8,&local_2f8,
                      &local_1f8);
  local_308 = by_ray;
  local_300 = 0;
  local_318.name = "origin";
  local_318._8_1_ = 2;
  local_328.name = "direction";
  local_328._8_1_ = 2;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_348.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  local_258.name = "callback";
  local_258._8_1_ = 2;
  pybind11::arg::operator=(&local_248,&local_258,(none *)&local_348);
  pybind11::class_<anurbs::RTree<3l>>::
  def<std::vector<long,std::allocator<long>>(anurbs::RTree<3l>::*)(Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,std::function<bool(long)>),pybind11::arg,pybind11::arg,pybind11::arg_v>
            (pcVar1,"by_ray",(offset_in_Model_to_subr *)&local_308,&local_318,&local_328,&local_248)
  ;
  pybind11::arg_v::~arg_v(&local_248);
  pybind11::object::~object(&local_348);
  pybind11::arg_v::~arg_v(&local_1f8);
  pybind11::object::~object(&local_340);
  pybind11::arg_v::~arg_v(&local_1a8);
  pybind11::object::~object(&local_338);
  pybind11::arg_v::~arg_v(&local_158);
  pybind11::arg_v::~arg_v(&local_68);
  pybind11::object::~object((object *)&local_350);
  std::__cxx11::string::~string((string *)local_278);
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        const std::string name = Type::python_name();

        py::class_<Type>(m, name.c_str())
            // constructors
            .def(py::init<Index, Index>(), "nb_items"_a, "node_size"_a=16)
            // private read-only properties
            .def_property_readonly("_boxes_min", &Type::boxes_min)
            .def_property_readonly("_boxes_max", &Type::boxes_max)
            // read-only properties
            .def_property_readonly("indices", &Type::indices)
            .def_property_readonly("min", &Type::min)
            .def_property_readonly("max", &Type::min)
            .def_property_readonly("nb_items", &Type::nb_items)
            .def_property_readonly("node_size", &Type::node_size)
            // methods
            .def("add", &Type::add, "box_a"_a, "box_b"_a)
            .def("finish", &Type::finish, "hilbert_sort"_a=true)
            .def("by_point", &Type::by_point, "location"_a, "tolerance"_a, "callback"_a=py::none())
            .def("by_box", &Type::by_box, "box_a"_a, "box_b"_a, "callback"_a=py::none())
            .def("by_ray", &Type::by_ray, "origin"_a, "direction"_a, "callback"_a=py::none())
        ;
    }